

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

void shutdown_system_driver(void)

{
  _func_void *p_Var1;
  
  if (active_sysdrv != (ALLEGRO_SYSTEM *)0x0) {
    if (active_sysdrv->user_exe_path != (ALLEGRO_PATH *)0x0) {
      al_destroy_path(active_sysdrv->user_exe_path);
    }
    if ((active_sysdrv->vt != (ALLEGRO_SYSTEM_INTERFACE *)0x0) &&
       (p_Var1 = active_sysdrv->vt->shutdown_system, p_Var1 != (_func_void *)0x0)) {
      (*p_Var1)();
    }
    active_sysdrv = (ALLEGRO_SYSTEM *)0x0;
    while (_al_system_interfaces._size != 0) {
      _al_vector_delete_at(&_al_system_interfaces,(int)_al_system_interfaces._size - 1);
    }
    _al_vector_free(&_al_system_interfaces);
    _al_vector_init(&_al_system_interfaces,8);
  }
  al_destroy_config(sys_config);
  sys_config = (ALLEGRO_CONFIG *)0x0;
  return;
}

Assistant:

static void shutdown_system_driver(void)
{
   if (active_sysdrv) {
      if (active_sysdrv->user_exe_path)
         al_destroy_path(active_sysdrv->user_exe_path);
      if (active_sysdrv->vt && active_sysdrv->vt->shutdown_system)
         active_sysdrv->vt->shutdown_system();
      active_sysdrv = NULL;
 
      while (!_al_vector_is_empty(&_al_system_interfaces))
         _al_vector_delete_at(&_al_system_interfaces, _al_vector_size(&_al_system_interfaces)-1);
      _al_vector_free(&_al_system_interfaces);
      _al_vector_init(&_al_system_interfaces, sizeof(ALLEGRO_SYSTEM_INTERFACE *));
   }
   al_destroy_config(sys_config);
   sys_config = NULL;
}